

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  long lVar2;
  long lVar3;
  DestructorFn *pDVar4;
  size_t sVar5;
  Expression *pEVar6;
  Block *trueJump;
  Block *falseJump;
  PoolItem *pPVar7;
  long lVar8;
  
  pMVar1 = this->newModule;
  pEVar6 = cloneExpression(this,*(Expression **)(__fn + 0x18));
  trueJump = getRemappedBlock(this,*(Block **)(__fn + 0x20));
  falseJump = getRemappedBlock(this,*(Block **)(__fn + 0x28));
  pPVar7 = PoolAllocator::allocateSpaceForObject(&pMVar1->allocator->pool,0xa0);
  heart::BranchIf::BranchIf((BranchIf *)&pPVar7->item,pEVar6,trueJump,falseJump);
  pPVar7->destructor =
       PoolAllocator::
       allocate<soul::heart::BranchIf,_soul::heart::Expression_&,_soul::heart::Block_&,_soul::heart::Block_&>
       ::anon_class_1_0_00000001::__invoke;
  lVar2 = *(long *)(__fn + 0x38);
  if (lVar2 != 0) {
    lVar3 = *(long *)(__fn + 0x30);
    lVar8 = 0;
    do {
      pEVar6 = cloneExpression(this,*(Expression **)(lVar3 + lVar8));
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                 (pPVar7 + 2),(size_t)(pPVar7[2].destructor + 1));
      pDVar4 = pPVar7[2].destructor;
      *(Expression **)(pPVar7[2].size + (long)pDVar4 * 8) = pEVar6;
      pPVar7[2].destructor = pDVar4 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar2 << 3 != lVar8);
  }
  lVar2 = *(long *)(__fn + 0x70);
  if (lVar2 != 0) {
    lVar3 = *(long *)(__fn + 0x68);
    lVar8 = 0;
    do {
      pEVar6 = cloneExpression(this,*(Expression **)(lVar3 + lVar8));
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                 &pPVar7[3].field_0x18,pPVar7[4].size + 1);
      sVar5 = pPVar7[4].size;
      *(Expression **)(*(long *)&pPVar7[3].field_0x18 + sVar5 * 8) = pEVar6;
      pPVar7[4].size = sVar5 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar2 << 3 != lVar8);
  }
  return (int)&pPVar7->item;
}

Assistant:

heart::BranchIf& clone (const heart::BranchIf& old)
    {
        auto& b =  newModule.allocate<heart::BranchIf> (cloneExpression (old.condition),
                                                        getRemappedBlock (old.targets[0]),
                                                        getRemappedBlock (old.targets[1]));

        for (auto& arg : old.targetArgs[0])
            b.targetArgs[0].push_back (cloneExpression (arg));

        for (auto& arg : old.targetArgs[1])
            b.targetArgs[1].push_back (cloneExpression (arg));

        return b;
    }